

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O2

void __thiscall amrex::FabArrayBase::flushPolarB(FabArrayBase *this,bool no_assertion)

{
  CommMetaData *this_00;
  const_iterator cVar1;
  _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_> it;
  pair<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_>,_std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_>_>
  pVar2;
  
  pVar2 = std::
          _Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_>_>
          ::equal_range((_Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_>_>
                         *)m_ThePolarBCache,&this->m_bdkey);
  for (cVar1._M_node = (_Base_ptr)pVar2.first._M_node;
      cVar1._M_node != (_Base_ptr)pVar2.second._M_node;
      cVar1._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar1._M_node)) {
    this_00 = (CommMetaData *)cVar1._M_node[1]._M_left;
    if (this_00 != (CommMetaData *)0x0) {
      CommMetaData::~CommMetaData(this_00);
    }
    operator_delete(this_00,0x48);
  }
  std::
  _Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_>_>
  ::_M_erase_aux((_Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_>_>
                  *)m_ThePolarBCache,(_Base_ptr)pVar2.first._M_node,(_Base_ptr)pVar2.second._M_node)
  ;
  return;
}

Assistant:

void
FabArrayBase::flushPolarB (bool no_assertion) const
{
    amrex::ignore_unused(no_assertion);
    AMREX_ASSERT(no_assertion || getBDKey() == m_bdkey);
    auto er_it = m_ThePolarBCache.equal_range(m_bdkey);
    for (auto it = er_it.first; it != er_it.second; ++it) {
        delete it->second;
    }
    m_ThePolarBCache.erase(er_it.first, er_it.second);
}